

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

int __thiscall HighsCliqueTable::unlink(HighsCliqueTable *this,char *__name)

{
  int *piVar1;
  CliqueVar CVar2;
  pointer pCVar3;
  pointer pCVar4;
  int in_EAX;
  uint uVar5;
  uint in_EDX;
  ulong hash;
  int local_4;
  
  pCVar3 = (this->cliqueentries).
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CVar2 = pCVar3[(int)__name];
  piVar1 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0));
  *piVar1 = *piVar1 + -1;
  pCVar4 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  CVar2 = pCVar3[(int)__name];
  uVar5 = (int)CVar2 << 1 | (uint)((int)CVar2 < 0);
  hash = (ulong)in_EDX * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
         (ulong)in_EDX * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32;
  if (pCVar4[(int)in_EDX].end - pCVar4[(int)in_EDX].start == 2) {
    HighsHashTree<int,_void>::erase_recurse
              (&(this->invertedHashListSizeTwo).
                super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(int)uVar5].root,hash,0,&local_4);
  }
  else {
    HighsHashTree<int,_int>::erase_recurse
              (&(this->invertedHashList).
                super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(int)uVar5].root,hash,0,&local_4);
  }
  return in_EAX;
}

Assistant:

void HighsCliqueTable::unlink(HighsInt pos, HighsInt cliqueid) {
  assert(pos >= 0);
  --numcliquesvar[cliqueentries[pos].index()];

  HighsInt cliquelen = cliques[cliqueid].end - cliques[cliqueid].start;
  if (cliquelen == 2)
    invertedHashListSizeTwo[cliqueentries[pos].index()].erase(cliqueid);
  else
    invertedHashList[cliqueentries[pos].index()].erase(cliqueid);
}